

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# green.c
# Opt level: O0

int green_future_result(green_future_t future,void **p,int *i)

{
  int *i_local;
  void **p_local;
  green_future_t future_local;
  
  if (future == (green_future_t)0x0) {
    future_local._4_4_ = 1;
  }
  else {
    if (future->refs < 1) {
      fprintf(_stderr,"Assertion failed: \"%s\". at %s:%d\n","future->refs > 0",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/src/green.c"
              ,0x27d);
      fflush(_stderr);
      abort();
    }
    if (future->state == green_future_pending) {
      future_local._4_4_ = 3;
    }
    else if (future->state == green_future_aborted) {
      future_local._4_4_ = 8;
    }
    else {
      if (p != (void **)0x0) {
        *p = (future->result).p;
      }
      if (i != (int *)0x0) {
        *i = (future->result).i;
      }
      future_local._4_4_ = 0;
    }
  }
  return future_local._4_4_;
}

Assistant:

int green_future_result(green_future_t future, void ** p, int * i)
{
    if (future == NULL) {
        return GREEN_EINVAL;
    }
    green_assert(future->refs > 0);

    if (future->state == green_future_pending) {
        return GREEN_EBUSY;
    }
    if (future->state == green_future_aborted) {
        return GREEN_EBADFD;
    }
    if (p) {
        *p = future->result.p;
    }
    if (i) {
        *i = future->result.i;
    }
    return GREEN_SUCCESS;
}